

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::InstrumentPass::Gen32BitCvtCode
          (InstrumentPass *this,uint32_t val_id,InstructionBuilder *builder)

{
  uint32_t uVar1;
  int iVar2;
  IRContext *this_00;
  TypeManager *this_01;
  DefUseManager *this_02;
  Instruction *pIVar3;
  Type *pTVar4;
  undefined4 extraout_var;
  uint32_t val_32b_reg_ty_id;
  Type *val_32b_reg_ty;
  Integer val_32b_ty;
  bool is_signed;
  Integer *val_ty;
  uint32_t val_ty_id;
  TypeManager *type_mgr;
  InstructionBuilder *builder_local;
  uint32_t val_id_local;
  InstrumentPass *this_local;
  
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_type_mgr(this_00);
  this_02 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar3 = analysis::DefUseManager::GetDef(this_02,val_id);
  uVar1 = Instruction::type_id(pIVar3);
  pTVar4 = analysis::TypeManager::GetType(this_01,uVar1);
  iVar2 = (*pTVar4->_vptr_Type[9])();
  uVar1 = analysis::Integer::width((Integer *)CONCAT44(extraout_var,iVar2));
  this_local._4_4_ = val_id;
  if (uVar1 != 0x20) {
    val_32b_ty._47_1_ = analysis::Integer::IsSigned((Integer *)CONCAT44(extraout_var,iVar2));
    analysis::Integer::Integer((Integer *)&val_32b_reg_ty,0x20,(bool)val_32b_ty._47_1_);
    pTVar4 = analysis::TypeManager::GetRegisteredType(this_01,(Type *)&val_32b_reg_ty);
    uVar1 = analysis::TypeManager::GetId(this_01,pTVar4);
    if ((val_32b_ty._47_1_ & 1) == 0) {
      pIVar3 = InstructionBuilder::AddUnaryOp(builder,uVar1,OpUConvert,val_id);
      this_local._4_4_ = Instruction::result_id(pIVar3);
    }
    else {
      pIVar3 = InstructionBuilder::AddUnaryOp(builder,uVar1,OpSConvert,val_id);
      this_local._4_4_ = Instruction::result_id(pIVar3);
    }
    analysis::Integer::~Integer((Integer *)&val_32b_reg_ty);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t InstrumentPass::Gen32BitCvtCode(uint32_t val_id,
                                         InstructionBuilder* builder) {
  // Convert integer value to 32-bit if necessary
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  uint32_t val_ty_id = get_def_use_mgr()->GetDef(val_id)->type_id();
  analysis::Integer* val_ty = type_mgr->GetType(val_ty_id)->AsInteger();
  if (val_ty->width() == 32) return val_id;
  bool is_signed = val_ty->IsSigned();
  analysis::Integer val_32b_ty(32, is_signed);
  analysis::Type* val_32b_reg_ty = type_mgr->GetRegisteredType(&val_32b_ty);
  uint32_t val_32b_reg_ty_id = type_mgr->GetId(val_32b_reg_ty);
  if (is_signed)
    return builder->AddUnaryOp(val_32b_reg_ty_id, spv::Op::OpSConvert, val_id)
        ->result_id();
  else
    return builder->AddUnaryOp(val_32b_reg_ty_id, spv::Op::OpUConvert, val_id)
        ->result_id();
}